

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

UnconditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::UnconditionalBranchDirectiveSyntax_const&>
          (BumpAllocator *this,UnconditionalBranchDirectiveSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  SyntaxKind SVar7;
  undefined4 uVar8;
  UnconditionalBranchDirectiveSyntax *pUVar9;
  
  pUVar9 = (UnconditionalBranchDirectiveSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UnconditionalBranchDirectiveSyntax *)this->endPtr < pUVar9 + 1) {
    pUVar9 = (UnconditionalBranchDirectiveSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pUVar9 + 1);
  }
  (pUVar9->super_DirectiveSyntax).directive.info = (args->super_DirectiveSyntax).directive.info;
  SVar7 = (args->super_DirectiveSyntax).super_SyntaxNode.kind;
  uVar8 = *(undefined4 *)&(args->super_DirectiveSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DirectiveSyntax).super_SyntaxNode.parent;
  TVar3 = (args->super_DirectiveSyntax).directive.kind;
  uVar4 = (args->super_DirectiveSyntax).directive.field_0x2;
  NVar5.raw = (args->super_DirectiveSyntax).directive.numFlags.raw;
  uVar6 = (args->super_DirectiveSyntax).directive.rawLen;
  (pUVar9->super_DirectiveSyntax).super_SyntaxNode.previewNode =
       (args->super_DirectiveSyntax).super_SyntaxNode.previewNode;
  (pUVar9->super_DirectiveSyntax).directive.kind = TVar3;
  (pUVar9->super_DirectiveSyntax).directive.field_0x2 = uVar4;
  (pUVar9->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar5.raw;
  (pUVar9->super_DirectiveSyntax).directive.rawLen = uVar6;
  (pUVar9->super_DirectiveSyntax).super_SyntaxNode.kind = SVar7;
  *(undefined4 *)&(pUVar9->super_DirectiveSyntax).super_SyntaxNode.field_0x4 = uVar8;
  (pUVar9->super_DirectiveSyntax).super_SyntaxNode.parent = pSVar1;
  uVar8 = *(undefined4 *)&(args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pUVar9->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->disabledTokens).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pUVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c7548;
  (pUVar9->disabledTokens).super_SyntaxListBase.childCount =
       (args->disabledTokens).super_SyntaxListBase.childCount;
  sVar2 = (args->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent
          ._M_extent_value;
  (pUVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pUVar9->disabledTokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pUVar9->disabledTokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c7488;
  return pUVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }